

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O2

Aig_Man_t * Fra_LcrDeriveAigForPartitioning(Fra_Lcr_t *pLcr)

{
  long *plVar1;
  Aig_Man_t *pAVar2;
  undefined8 *puVar3;
  Aig_Obj_t *pAVar4;
  Fra_Cla_t *pFVar5;
  int *piVar6;
  int iVar7;
  Aig_Obj_t *pAVar8;
  int iVar9;
  long lVar10;
  
  lVar10 = 0;
  while( true ) {
    pAVar2 = pLcr->pAig;
    if (pAVar2->vCis->nSize <= lVar10) break;
    plVar1 = (long *)Vec_PtrEntry(pAVar2->vCis,(int)lVar10);
    plVar1[5] = (long)pLcr;
    *plVar1 = lVar10;
    lVar10 = lVar10 + 1;
  }
  iVar9 = pAVar2->nObjs[3] - pAVar2->nObjs[2];
  Aig_ManCleanData(pAVar2);
  pAVar2 = Aig_ManStartFrom(pLcr->pAig);
  iVar7 = 0;
  do {
    pFVar5 = pLcr->pCla;
    if (pFVar5->vClasses->nSize <= iVar7) {
      iVar7 = 0;
      while( true ) {
        if (pFVar5->vClasses1->nSize <= iVar7) {
          return pAVar2;
        }
        piVar6 = (int *)Vec_PtrEntry(pFVar5->vClasses1,iVar7);
        if ((piVar6[6] & 7U) != 2) break;
        pAVar8 = Aig_ManCo(pLcr->pAig,*piVar6 + iVar9);
        pAVar8 = Fra_LcrManDup_rec(pAVar2,pLcr->pAig,
                                   (Aig_Obj_t *)((ulong)pAVar8->pFanin0 & 0xfffffffffffffffe));
        Aig_ObjCreateCo(pAVar2,pAVar8);
        iVar7 = iVar7 + 1;
        pFVar5 = pLcr->pCla;
      }
      __assert_fail("Aig_ObjIsCi(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraLcr.c"
                    ,0x148,"Aig_Man_t *Fra_LcrDeriveAigForPartitioning(Fra_Lcr_t *)");
    }
    puVar3 = (undefined8 *)Vec_PtrEntry(pFVar5->vClasses,iVar7);
    pAVar8 = (Aig_Obj_t *)((ulong)pAVar2->pConst1 ^ 1);
    for (; piVar6 = (int *)*puVar3, piVar6 != (int *)0x0; puVar3 = puVar3 + 1) {
      if ((piVar6[6] & 7U) != 2) {
        __assert_fail("Aig_ObjIsCi(ppClass[c])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraLcr.c"
                      ,0x13e,"Aig_Man_t *Fra_LcrDeriveAigForPartitioning(Fra_Lcr_t *)");
      }
      pAVar4 = Aig_ManCo(pLcr->pAig,*piVar6 + iVar9);
      pAVar4 = Fra_LcrManDup_rec(pAVar2,pLcr->pAig,
                                 (Aig_Obj_t *)((ulong)pAVar4->pFanin0 & 0xfffffffffffffffe));
      pAVar8 = Aig_Exor(pAVar2,pAVar8,pAVar4);
    }
    Aig_ObjCreateCo(pAVar2,pAVar8);
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Fra_LcrDeriveAigForPartitioning( Fra_Lcr_t * pLcr )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjPo, * pObjNew, ** ppClass, * pMiter;
    int i, c, Offset;
    // remember the numbers of the inputs of the original AIG
    Aig_ManForEachCi( pLcr->pAig, pObj, i )
    {
        pObj->pData = pLcr;
        pObj->pNext = (Aig_Obj_t *)(long)i;
    }
    // compute the LO/LI offset
    Offset = Aig_ManCoNum(pLcr->pAig) - Aig_ManCiNum(pLcr->pAig);
    // create the PIs
    Aig_ManCleanData( pLcr->pAig );
    pNew = Aig_ManStartFrom( pLcr->pAig );
    // go over the equivalence classes
    Vec_PtrForEachEntry( Aig_Obj_t **, pLcr->pCla->vClasses, ppClass, i )
    {
        pMiter = Aig_ManConst0(pNew);
        for ( c = 0; ppClass[c]; c++ )
        {
            assert( Aig_ObjIsCi(ppClass[c]) );
            pObjPo  = Aig_ManCo( pLcr->pAig, Offset+(long)ppClass[c]->pNext );
            pObjNew = Fra_LcrManDup_rec( pNew, pLcr->pAig, Aig_ObjFanin0(pObjPo) );
            pMiter  = Aig_Exor( pNew, pMiter, pObjNew );
        }
        Aig_ObjCreateCo( pNew, pMiter );
    }
    // go over the constant candidates
    Vec_PtrForEachEntry( Aig_Obj_t *, pLcr->pCla->vClasses1, pObj, i )
    {
        assert( Aig_ObjIsCi(pObj) );
        pObjPo = Aig_ManCo( pLcr->pAig, Offset+(long)pObj->pNext );
        pMiter = Fra_LcrManDup_rec( pNew, pLcr->pAig, Aig_ObjFanin0(pObjPo) );
        Aig_ObjCreateCo( pNew, pMiter );
    }
    return pNew;
}